

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboRepeatedClearBlitTex2DCase::render
          (FboRepeatedClearBlitTex2DCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int iVar1;
  long lVar2;
  int dstX0;
  deUint32 fbos [2];
  TextureFormat fboFormat;
  deUint32 textures [2];
  Vec4 color;
  Random rnd;
  TextureFormatInfo fmtInfo;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  deRandom_init(&rnd.m_rnd,0x1153f3e);
  fbos[0] = 0;
  fbos[1] = 0;
  textures[0] = 0;
  textures[1] = 0;
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenFramebuffers(this_00,2,fbos);
  sglr::ContextWrapper::glGenTextures(this_00,2,textures);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,*(deUint32 *)((long)textures + lVar2));
    sglr::ContextWrapper::glTexStorage2D
              (this_00,0xde1,1,(this->super_FboColorbufferCase).m_format,
               *(int *)((long)&DAT_0182eed8 + lVar2),*(int *)((long)&DAT_0182eed8 + lVar2));
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*(deUint32 *)((long)fbos + lVar2));
    sglr::ContextWrapper::glFramebufferTexture2D
              (this_00,0x8d40,0x8ce0,0xde1,*(deUint32 *)((long)textures + lVar2),0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  }
  tcu::Vector<float,_4>::Vector(&color,0.0);
  FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    dstX0 = 0;
    while (dstX0 != 0x40) {
      randomVector<4>((Functional *)&color,&rnd,&fmtInfo.valueMin,&fmtInfo.valueMax);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[0]);
      FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,fbos[1]);
      sglr::ContextWrapper::glBlitFramebuffer
                (this_00,0,0,0x10,0x10,dstX0,iVar1 * 0x10,dstX0 + 0x10,iVar1 * 0x10 + 0x10,0x4000,
                 0x2600);
      dstX0 = dstX0 + 0x10;
    }
  }
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[1]);
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,0x40,0x40,&fboFormat,&fmtInfo.lookupScale,
             &fmtInfo.lookupBias);
  FboTestCase::checkError((FboTestCase *)this);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			glTexStorage2D(GL_TEXTURE_2D, 1, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbos[1]);
			glBlitFramebuffer(0, 0, cellSize, cellSize, cellX*cellSize, cellY*cellSize, (cellX+1)*cellSize, (cellY+1)*cellSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}